

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void * parse_logic(Parser *parser)

{
  Kind KVar1;
  Token *op;
  void *right;
  Token *tok;
  void *left;
  Parser *parser_local;
  
  parser_local = (Parser *)parse_or(parser);
  op = parser->token;
  KVar1 = parser->token->kind;
  if (KVar1 == OR2 || KVar1 == AND2) {
    move(parser);
    right = parse_or(parser);
    parser_local = (Parser *)new_binary_expr(parser_local,op,right);
  }
  return parser_local;
}

Assistant:

void *parse_logic(Parser *parser) {
    void *left = parse_or(parser);
    Token *tok = token(parser);
    switch (token(parser)->kind) {
        case AND2:
        case OR2:
            move(parser);
            return new_binary_expr(left, tok, parse_or(parser));
        default:
            return left;
    }
}